

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

void __thiscall Network::Address::URL::normalizePath(URL *this,String *pathToNormalize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  String *pSVar4;
  String outputStack;
  String local_60;
  String local_50;
  String local_40;
  
  Bstrlib::String::String(&local_50);
  if ((pathToNormalize->super_tagbstring).slen != 0) {
    do {
      iVar2 = (int)pathToNormalize;
      Bstrlib::String::midString(&local_60,iVar2,0);
      bVar1 = Bstrlib::String::operator==(&local_60,"../");
      Bstrlib::String::~String(&local_60);
      pSVar4 = &local_60;
      if (bVar1) {
        Bstrlib::String::midString(&local_60,iVar2,3);
        Bstrlib::String::operator=(pathToNormalize,&local_60);
LAB_0010dc42:
        Bstrlib::String::~String(pSVar4);
      }
      else {
        Bstrlib::String::midString(&local_60,iVar2,0);
        bVar1 = Bstrlib::String::operator==(&local_60,"./");
        Bstrlib::String::~String(&local_60);
        if (bVar1) {
          Bstrlib::String::midString(&local_60,iVar2,2);
          Bstrlib::String::operator=(pathToNormalize,&local_60);
          goto LAB_0010dc42;
        }
        Bstrlib::String::midString(&local_60,iVar2,0);
        bVar1 = Bstrlib::String::operator==(&local_60,"/./");
        Bstrlib::String::~String(&local_60);
        if (bVar1) {
          Bstrlib::String::midString(&local_40,iVar2,3);
          Bstrlib::operator+((char *)&local_60,(String *)0x12098a);
          Bstrlib::String::operator=(pathToNormalize,&local_60);
LAB_0010dcfc:
          Bstrlib::String::~String(&local_60);
          pSVar4 = &local_40;
          goto LAB_0010dc42;
        }
        bVar1 = Bstrlib::String::operator==(pathToNormalize,"/.");
        if (bVar1) {
          Bstrlib::String::midString(&local_40,iVar2,2);
          Bstrlib::operator+((char *)&local_60,(String *)0x12098a);
          Bstrlib::String::operator=(pathToNormalize,&local_60);
          goto LAB_0010dcfc;
        }
        Bstrlib::String::midString(&local_60,iVar2,0);
        bVar1 = Bstrlib::String::operator==(&local_60,"/..");
        if (bVar1) {
          Bstrlib::String::~String(&local_60);
LAB_0010dd5e:
          Bstrlib::String::midString(&local_40,iVar2,4);
          Bstrlib::operator+((char *)&local_60,(String *)0x12098a);
          Bstrlib::String::operator=(pathToNormalize,&local_60);
          Bstrlib::String::~String(&local_60);
          Bstrlib::String::~String(&local_40);
          iVar2 = Bstrlib::String::reverseFind(&local_50,'/',local_50.super_tagbstring.slen);
          if (iVar2 != -1) {
            Bstrlib::String::midString(&local_60,(int)&local_50,0);
            Bstrlib::String::operator=(&local_50,&local_60);
            goto LAB_0010dc42;
          }
        }
        else {
          bVar1 = Bstrlib::String::operator==(pathToNormalize,"/../");
          Bstrlib::String::~String(&local_60);
          if (bVar1) goto LAB_0010dd5e;
          iVar3 = Bstrlib::String::invFindAnyChar(pathToNormalize,".",0);
          if (iVar3 == -1) {
            Bstrlib::String::operator=(pathToNormalize,"");
          }
          else {
            iVar3 = Bstrlib::String::Find(pathToNormalize,'/',0);
            if (iVar3 == 0) {
              iVar3 = Bstrlib::String::Find(pathToNormalize,'/',1);
            }
            if (iVar3 != -1) {
              Bstrlib::String::midString(&local_60,iVar2,0);
              Bstrlib::String::operator+=(&local_50,&local_60);
              Bstrlib::String::~String(&local_60);
              Bstrlib::String::midString(&local_60,iVar2,iVar3);
              Bstrlib::String::operator=(pathToNormalize,&local_60);
              goto LAB_0010dc42;
            }
            Bstrlib::String::operator+=(&local_50,pathToNormalize);
            Bstrlib::String::operator=(pathToNormalize,"");
          }
        }
      }
    } while ((pathToNormalize->super_tagbstring).slen != 0);
  }
  Bstrlib::String::operator=(pathToNormalize,&local_50);
  Bstrlib::String::~String(&local_50);
  return;
}

Assistant:

void URL::normalizePath(String & pathToNormalize) const
        {
            String outputStack;

            while (pathToNormalize.getLength())
            {
                if (pathToNormalize.midString(0, 3) == "../") pathToNormalize = pathToNormalize.midString(3, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 2) == "./") pathToNormalize = pathToNormalize.midString(2, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 3) == "/./") pathToNormalize = "/" + pathToNormalize.midString(3, pathToNormalize.getLength());
                else if (pathToNormalize == "/.") pathToNormalize = "/" + pathToNormalize.midString(2, pathToNormalize.getLength());
                else if (pathToNormalize.midString(0, 3) == "/.." || pathToNormalize == "/../")
                {
                    pathToNormalize = "/" + pathToNormalize.midString(4, pathToNormalize.getLength());
                    int lastSegmentPos = outputStack.reverseFind('/', outputStack.getLength());
                    if (lastSegmentPos != -1) outputStack = outputStack.midString(0, lastSegmentPos);
                }
                else if (pathToNormalize.invFindAnyChar(".", 0) == -1) pathToNormalize = "";
                else
                {
                    int firstSlash = pathToNormalize.Find('/', 0);
                    if (firstSlash == 0) firstSlash = pathToNormalize.Find('/', 1);
                    if (firstSlash == -1) { outputStack += pathToNormalize; pathToNormalize = ""; }
                    else
                    {
                        outputStack += pathToNormalize.midString(0, firstSlash);
                        pathToNormalize = pathToNormalize.midString(firstSlash, pathToNormalize.getLength());
                    }
                }
            }
            pathToNormalize = outputStack;
        }